

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  
  lVar2 = (long)table->ColumnsCount;
  if (lVar2 < 1) {
    fVar5 = 0.0;
    fVar4 = 0.0;
  }
  else {
    pIVar1 = (table->Columns).Data;
    fVar4 = 0.0;
    lVar3 = 0;
    fVar5 = 0.0;
    do {
      if (((&pIVar1->IsEnabled)[lVar3] == true) &&
         ((*(byte *)((long)&pIVar1->Flags + lVar3) & 8) != 0)) {
        fVar4 = fVar4 + *(float *)((long)&pIVar1->StretchWeight + lVar3);
        fVar5 = fVar5 + *(float *)((long)&pIVar1->WidthRequest + lVar3);
      }
      lVar3 = lVar3 + 0x68;
    } while (lVar2 * 0x68 - lVar3 != 0);
  }
  if (0 < table->ColumnsCount) {
    pIVar1 = (table->Columns).Data;
    lVar3 = 0;
    do {
      if (((&pIVar1->IsEnabled)[lVar3] == true) &&
         ((*(byte *)((long)&pIVar1->Flags + lVar3) & 8) != 0)) {
        *(float *)((long)&pIVar1->StretchWeight + lVar3) =
             (*(float *)((long)&pIVar1->WidthRequest + lVar3) / fVar5) * fVar4;
      }
      lVar3 = lVar3 + 0x68;
    } while (lVar2 * 0x68 - lVar3 != 0);
  }
  return;
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}